

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int queue_5_3::deQueue(sq_queue *q,int *e)

{
  allocator local_41;
  string local_40 [32];
  int *local_20;
  int *e_local;
  sq_queue *q_local;
  
  if (q->front == q->rear) {
    local_20 = e;
    e_local = (int *)q;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,anon_var_dwarf_7dc,&local_41);
    q_local._4_4_ = errCode((string *)local_40,0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    *e = q->data[q->front];
    q->front = (q->front + 1) % q->ssize;
    q_local._4_4_ = 1;
  }
  return q_local._4_4_;
}

Assistant:

int deQueue(sq_queue &q, int &e) {
        if (q.front == q.rear)
            return errCode("空队", 0);

        e = q.data[q.front];
        q.front = (q.front + 1) % q.ssize;
        return 1;
    }